

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

void __thiscall soplex::SPxSteepPR<double>::addedVecs(SPxSteepPR<double> *this,int n)

{
  SPxSolverBase<double> *pSVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  pdVar2 = (pSVar1->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar3 = (pSVar1->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  VectorBase<double>::reDim(&pSVar1->weights,(pSVar1->thevectors->set).thenum,true);
  if (((this->super_SPxPricer<double>).thesolver)->theType == ENTER) {
    pdVar4 = (pSVar1->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (pSVar1->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar6 = (long)(int)((ulong)((long)pdVar2 - (long)pdVar3) >> 3);
        lVar6 < (int)((ulong)((long)pdVar5 - (long)pdVar4) >> 3); lVar6 = lVar6 + 1) {
      pdVar4[lVar6] = 2.0;
    }
  }
  return;
}

Assistant:

void SPxSteepPR<R>::addedVecs(int n)
{
   VectorBase<R>& weights = this->thesolver->weights;
   n = weights.dim();
   weights.reDim(this->thesolver->coDim());

   if(this->thesolver->type() == SPxSolverBase<R>::ENTER)
   {
      for(; n < weights.dim(); ++n)
         weights[n] = 2;
   }
}